

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data)

{
  long lVar1;
  char *pcVar2;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"${VERSION}\n\n",0xc);
  pcVar2 = "${OUT_PER_VERTEX_DECL}";
  if (should_pass_pointsize_data) {
    pcVar2 = "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
  }
  lVar1 = 0x16;
  if (should_pass_pointsize_data) {
    lVar1 = 0x21;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\nvoid main()\n{\n}\n",0x11);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode(
	bool should_pass_pointsize_data)
{
	std::stringstream result_sstream;
	result_sstream << "${VERSION}\n\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "\n"
					  "void main()\n"
					  "{\n"
					  "}\n";

	return result_sstream.str();
}